

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_Mesh::EmergencyDestroy(ON_Mesh *this)

{
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])(this,0);
  (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a = (ON_3dPoint *)0x0;
  (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
  (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity = 0;
  (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a = (ON_3fPoint *)0x0;
  (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count = 0;
  (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity = 0;
  (this->m_F).m_a = (ON_MeshFace *)0x0;
  (this->m_F).m_count = 0;
  (this->m_F).m_capacity = 0;
  (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a = (ON_3fVector *)0x0;
  (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity = 0;
  (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a = (ON_3fVector *)0x0;
  (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count = 0;
  (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity = 0;
  (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a = (ON_2fPoint *)0x0;
  (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count = 0;
  (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity = 0;
  (this->m_TC).m_a = (ON_TextureCoordinates *)0x0;
  (this->m_TC).m_count = 0;
  (this->m_TC).m_capacity = 0;
  (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a = (ON_2dPoint *)0x0;
  (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
  (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity = 0;
  (this->m_K).m_a = (ON_SurfaceCurvature *)0x0;
  (this->m_K).m_count = 0;
  (this->m_K).m_capacity = 0;
  (this->m_C).m_a = (ON_Color *)0x0;
  (this->m_C).m_count = 0;
  (this->m_C).m_capacity = 0;
  (this->m_NgonMap).m_a = (uint *)0x0;
  (this->m_NgonMap).m_count = 0;
  (this->m_NgonMap).m_capacity = 0;
  (this->m_Ngon).m_a = (ON_MeshNgon **)0x0;
  (this->m_Ngon).m_count = 0;
  (this->m_Ngon).m_capacity = 0;
  return;
}

Assistant:

void ON_Mesh::EmergencyDestroy()
{
  DestroyRuntimeCache( false );
  m_dV.EmergencyDestroy();
  m_V.EmergencyDestroy();
  m_F.EmergencyDestroy();
  m_N.EmergencyDestroy();
  m_FN.EmergencyDestroy();
  m_T.EmergencyDestroy();
  m_TC.EmergencyDestroy();
  m_S.EmergencyDestroy();
  m_K.EmergencyDestroy();
  m_C.EmergencyDestroy();
  m_NgonMap.EmergencyDestroy();
  m_Ngon.EmergencyDestroy();
}